

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

string * __thiscall Vehicle::name_abi_cxx11_(string *__return_storage_ptr__,Vehicle *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_name);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return _name; }